

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp_message.h
# Opt level: O2

string * __thiscall
fineftp::FtpMessage::str_abi_cxx11_(string *__return_storage_ptr__,FtpMessage *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string local_38;
  
  std::__cxx11::to_string(&local_38,this->code_);
  ::std::operator+(&bStack_78,&local_38," ");
  ::std::operator+(&local_58,&bStack_78,&this->message_);
  ::std::operator+(__return_storage_ptr__,&local_58,"\r\n");
  ::std::__cxx11::string::~string((string *)&local_58);
  ::std::__cxx11::string::~string((string *)&bStack_78);
  ::std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

inline std::string str() const
    {
      return std::to_string(static_cast<int>(code_)) + " " + message_ + "\r\n";
    }